

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::print(Simulator *this,PCode *code)

{
  ostream *poVar1;
  simulator_error *this_00;
  _Elt_pointer pSVar2;
  allocator local_8d;
  int local_8c;
  string local_88;
  StackSymbol symbol;
  
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&symbol,pSVar2 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  if (symbol.type_ == kReal) {
    poVar1 = std::ostream::_M_insert<double>(symbol.value_.real_value);
  }
  else {
    if (symbol.type_ != kInt) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_8c = this->eip_;
      std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_adf2,&local_8d);
      simulator_error::simulator_error(this_00,&local_8c,&local_88);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,symbol.value_.int_value);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  this->eip_ = this->eip_ + 1;
  StackSymbol::UnionValue::~UnionValue(&symbol.value_);
  return;
}

Assistant:

void Simulator::print(const PCode &code) {
    StackSymbol symbol = stack_.back();
    stack_.pop_back();

    if (symbol.type() == StackSymbol::Type::kInt) {
        std::cout << symbol.int_value() << std::endl;
    } else if (symbol.type() == StackSymbol::Type::kReal) {
        std::cout << symbol.real_value() << std::endl;
    } else {
        throw simulator_error(eip(), "不合法的输出参数");
    }

    inc_eip();
}